

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void testing::internal::ReportUninterestingCall(CallReaction reaction,string *msg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_1c;
  string *psStack_18;
  int stack_frames_to_skip;
  string *msg_local;
  CallReaction reaction_local;
  
  psStack_18 = msg;
  msg_local._4_4_ = reaction;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gmock_verbose_abi_cxx11_,"info");
  local_1c = bVar1 - 1 | 3;
  if (msg_local._4_4_ == kAllow) {
    Log(kInfo,psStack_18,local_1c);
  }
  else if (msg_local._4_4_ == kWarn) {
    std::operator+(&local_40,psStack_18,
                   "\nNOTE: You can safely ignore the above warning unless this call should not happen.  Do not suppress it by blindly adding an EXPECT_CALL() if you don\'t mean to enforce the call.  See https://github.com/google/googletest/blob/master/docs/gmock_cook_book.md#knowing-when-to-expect for details.\n"
                  );
    Log(kWarning,&local_40,local_1c);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    Expect(false,(char *)0x0,-1,psStack_18);
  }
  return;
}

Assistant:

void ReportUninterestingCall(CallReaction reaction, const std::string& msg) {
  // Include a stack trace only if --gmock_verbose=info is specified.
  const int stack_frames_to_skip =
      GMOCK_FLAG_GET(verbose) == kInfoVerbosity ? 3 : -1;
  switch (reaction) {
    case kAllow:
      Log(kInfo, msg, stack_frames_to_skip);
      break;
    case kWarn:
      Log(kWarning,
          msg +
              "\nNOTE: You can safely ignore the above warning unless this "
              "call should not happen.  Do not suppress it by blindly adding "
              "an EXPECT_CALL() if you don't mean to enforce the call.  "
              "See "
              "https://github.com/google/googletest/blob/master/docs/"
              "gmock_cook_book.md#"
              "knowing-when-to-expect for details.\n",
          stack_frames_to_skip);
      break;
    default:  // FAIL
      Expect(false, nullptr, -1, msg);
  }
}